

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyRender.cpp
# Opt level: O3

void __thiscall TRM::TinyRender::attachBuffer(TinyRender *this,TGAImage *image)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  float *pfVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  this->mImage = image;
  if (((image != (TGAImage *)0x0) && (iVar2 = TGAImage::get_width(image), 0 < iVar2)) &&
     (iVar2 = TGAImage::get_height(this->mImage), 0 < iVar2)) {
    if (this->mZBuffer != (float *)0x0) {
      operator_delete__(this->mZBuffer);
      this->mZBuffer = (float *)0x0;
    }
    iVar2 = TGAImage::get_width(this->mImage);
    iVar3 = TGAImage::get_height(this->mImage);
    iVar3 = iVar3 * iVar2;
    lVar6 = (long)iVar3;
    uVar5 = 0xffffffffffffffff;
    if (-1 < iVar3) {
      uVar5 = lVar6 * 4;
    }
    pfVar4 = (float *)operator_new__(uVar5);
    this->mZBuffer = pfVar4;
    auVar1 = _DAT_00108160;
    if (iVar3 != 0) {
      lVar7 = lVar6 + -1;
      auVar8._8_4_ = (int)lVar7;
      auVar8._0_8_ = lVar7;
      auVar8._12_4_ = (int)((ulong)lVar7 >> 0x20);
      uVar5 = 0;
      auVar8 = auVar8 ^ _DAT_00108160;
      auVar9 = _DAT_00108140;
      auVar10 = _DAT_00108150;
      do {
        auVar11 = auVar10 ^ auVar1;
        iVar2 = auVar8._4_4_;
        if ((bool)(~(auVar11._4_4_ == iVar2 && auVar8._0_4_ < auVar11._0_4_ || iVar2 < auVar11._4_4_
                    ) & 1)) {
          pfVar4[uVar5] = 3.4028235e+38;
        }
        if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
            auVar11._12_4_ <= auVar8._12_4_) {
          pfVar4[uVar5 + 1] = 3.4028235e+38;
        }
        auVar11 = auVar9 ^ auVar1;
        iVar3 = auVar11._4_4_;
        if (iVar3 <= iVar2 && (iVar3 != iVar2 || auVar11._0_4_ <= auVar8._0_4_)) {
          pfVar4[uVar5 + 2] = 3.4028235e+38;
          pfVar4[uVar5 + 3] = 3.4028235e+38;
        }
        uVar5 = uVar5 + 4;
        lVar7 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 4;
        auVar10._8_8_ = lVar7 + 4;
        lVar7 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 4;
        auVar9._8_8_ = lVar7 + 4;
      } while ((lVar6 + 3U & 0xfffffffffffffffc) != uVar5);
    }
  }
  return;
}

Assistant:

void TinyRender::attachBuffer(TGAImage* image) {
  mImage = image;
  if (mImage != nullptr && mImage->get_width() > 0 &&
      mImage->get_height() > 0) {
    if (mZBuffer != nullptr) {
      delete[] mZBuffer;
      mZBuffer = nullptr;
    }

    int width = mImage->get_width();
    int height = mImage->get_height();
    mZBuffer = new float[width * height];
    for (size_t i = 0; i < width * height; i++) {
      mZBuffer[i] = std::numeric_limits<float>::max();
    }
  }
}